

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBooleanStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::BooleanStateQueryTests::init
          (BooleanStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined1 uVar1;
  undefined4 uVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  int iVar5;
  IsEnabledVerifier *this_00;
  undefined4 extraout_var;
  GetBooleanVerifier *this_01;
  undefined4 extraout_var_00;
  GetIntegerVerifier *this_02;
  undefined4 extraout_var_01;
  StateVerifier *pSVar6;
  undefined4 extraout_var_02;
  undefined **ppuVar7;
  ApiCase *pAVar8;
  int _verifierNdx;
  long lVar9;
  long lVar10;
  allocator<char> local_e1;
  BooleanStateQueryTests *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ApiCase *local_b8;
  undefined **local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  StateVerifier *normalVerifiers [3];
  StateVerifier *isEnabledVerifiers [4];
  
  this_00 = (IsEnabledVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::IsEnabledVerifier::IsEnabledVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierIsEnabled = this_00;
  this_01 = (GetBooleanVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierBoolean = this_01;
  this_02 = (GetIntegerVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_02,(Functions *)CONCAT44(extraout_var_01,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger = this_02;
  pSVar6 = (StateVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  BooleanStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            ((GetFloatVerifier *)pSVar6,(Functions *)CONCAT44(extraout_var_02,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = (GetFloatVerifier *)pSVar6;
  isEnabledVerifiers[0] = &this->m_verifierIsEnabled->super_StateVerifier;
  ppuVar7 = (undefined **)this->m_verifierBoolean;
  isEnabledVerifiers[1] = (StateVerifier *)ppuVar7;
  isEnabledVerifiers[2] = &this->m_verifierInteger->super_StateVerifier;
  isEnabledVerifiers[3] = pSVar6;
  normalVerifiers[0] = (StateVerifier *)ppuVar7;
  normalVerifiers[1] = &this->m_verifierInteger->super_StateVerifier;
  normalVerifiers[2] = pSVar6;
  local_e0 = this;
  for (lVar10 = 0; lVar10 != 9; lVar10 = lVar10 + 1) {
    ppuVar7 = &PTR_anon_var_dwarf_11a4ecf_01e1e460;
    local_b0 = &PTR_anon_var_dwarf_11a4ecf_01e1e460 + lVar10 * 3;
    for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
      pTVar3 = (TestContext *)isEnabledVerifiers[lVar9];
      local_b8 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,*local_b0,&local_e1);
      std::operator+(&local_d8,&local_a8,(char *)pTVar3->m_watchDog);
      pAVar8 = local_b8;
      uVar2 = *(undefined4 *)(local_b0 + 2);
      uVar1 = *(undefined1 *)((long)local_b0 + 0x14);
      ApiCase::ApiCase(local_b8,pCVar4,local_d8._M_dataplus._M_p,local_b0[1]);
      this = local_e0;
      (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_01e1e5e8;
      *(undefined4 *)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = uVar2;
      *(undefined1 *)
       ((long)&pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar1;
      pAVar8[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
      tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pAVar8);
      std::__cxx11::string::~string((string *)&local_d8);
      ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_a8);
    }
  }
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    pSVar6 = normalVerifiers[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"sample_coverage_invert",&local_e1);
    std::operator+(&local_d8,&local_a8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar8,pCVar4,local_d8._M_dataplus._M_p,"SAMPLE_COVERAGE_INVERT");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e1e640;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pAVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_a8);
    this = local_e0;
  }
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    pSVar6 = normalVerifiers[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"color_writemask",&local_e1);
    std::operator+(&local_d8,&local_a8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar8,pCVar4,local_d8._M_dataplus._M_p,"COLOR_WRITEMASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e1e698;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pAVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_a8);
    this = local_e0;
  }
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    pSVar6 = normalVerifiers[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"depth_writemask",&local_e1);
    std::operator+(&local_d8,&local_a8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar8,pCVar4,local_d8._M_dataplus._M_p,"DEPTH_WRITEMASK");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e1e6f0;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pAVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_a8);
    this = local_e0;
  }
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    pSVar6 = normalVerifiers[lVar10];
    pAVar8 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"shader_compiler",&local_e1);
    std::operator+(&local_d8,&local_a8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar8,pCVar4,local_d8._M_dataplus._M_p,"SHADER_COMPILER");
    (pAVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_01e1e748;
    pAVar8[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pAVar8);
    std::__cxx11::string::~string((string *)&local_d8);
    ppuVar7 = (undefined **)std::__cxx11::string::~string((string *)&local_a8);
    this = local_e0;
  }
  return (int)ppuVar7;
}

Assistant:

void BooleanStateQueryTests::init (void)
{
	DE_ASSERT(m_verifierIsEnabled == DE_NULL);
	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierIsEnabled		= new IsEnabledVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	StateVerifier* isEnabledVerifiers[] = {m_verifierIsEnabled, m_verifierBoolean, m_verifierInteger, m_verifierFloat};
	StateVerifier* normalVerifiers[]	= {						m_verifierBoolean, m_verifierInteger, m_verifierFloat};

	struct StateBoolean
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		bool			value;
	};
	const StateBoolean isEnableds[] =
	{
		{ "cull_face",						"CULL_FACE",						GL_CULL_FACE,						false},
		{ "polygon_offset_fill",			"POLYGON_OFFSET_FILL",				GL_POLYGON_OFFSET_FILL,				false},
		{ "sample_alpha_to_coverage",		"SAMPLE_ALPHA_TO_COVERAGE",			GL_SAMPLE_ALPHA_TO_COVERAGE,		false},
		{ "sample_coverage",				"SAMPLE_COVERAGE",					GL_SAMPLE_COVERAGE,					false},
		{ "scissor_test",					"SCISSOR_TEST",						GL_SCISSOR_TEST,					false},
		{ "stencil_test",					"STENCIL_TEST",						GL_STENCIL_TEST,					false},
		{ "depth_test",						"DEPTH_TEST",						GL_DEPTH_TEST,						false},
		{ "blend",							"BLEND",							GL_BLEND,							false},
		{ "dither",							"DITHER",							GL_DITHER,							true },
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(isEnableds); testNdx++)
		FOR_EACH_VERIFIER(isEnabledVerifiers, addChild(new IsEnabledStateTestCase(m_context, verifier, (std::string(isEnableds[testNdx].name) + verifier->getTestNamePostfix()).c_str(), isEnableds[testNdx].description, isEnableds[testNdx].targetName, isEnableds[testNdx].value)));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SampleCoverageInvertTestCase				(m_context, verifier, (std::string("sample_coverage_invert")				+ verifier->getTestNamePostfix()).c_str(), "SAMPLE_COVERAGE_INVERT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ColorMaskTestCase							(m_context, verifier, (std::string("color_writemask")						+ verifier->getTestNamePostfix()).c_str(), "COLOR_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthWriteMaskTestCase						(m_context, verifier, (std::string("depth_writemask")						+ verifier->getTestNamePostfix()).c_str(), "DEPTH_WRITEMASK")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ShaderCompilerTestCase						(m_context, verifier, (std::string("shader_compiler")						+ verifier->getTestNamePostfix()).c_str(), "SHADER_COMPILER")));
}